

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitImportedFunction(PrintSExpression *this,Function *curr)

{
  uintptr_t in_RAX;
  Signature sig;
  HeapType local_28;
  
  local_28.id = in_RAX;
  doIndent(this->o,this->indent);
  this->currFunction = curr;
  (this->lastPrintedLocation).fileIndex = 0;
  (this->lastPrintedLocation).lineNumber = 0;
  (this->lastPrintedLocation).columnNumber = 0;
  std::operator<<(this->o,'(');
  emitImportHeader(this,&curr->super_Importable);
  sig = HeapType::getSignature(&curr->type);
  HeapType::HeapType(&local_28,sig);
  handleSignature(this,local_28,(Name)(curr->super_Importable).super_Named.name.super_IString.str);
  std::operator<<(this->o,')');
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void visitImportedFunction(Function* curr) {
    doIndent(o, indent);
    currFunction = curr;
    lastPrintedLocation = {0, 0, 0};
    o << '(';
    emitImportHeader(curr);
    handleSignature(curr->getSig(), curr->name);
    o << ')';
    o << maybeNewLine;
  }